

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O1

Array2D<double> * __thiscall
pbrt::SummedAreaTable::integrate
          (Array2D<double> *__return_storage_ptr__,SummedAreaTable *this,Array2D<float> *values,
          Allocator alloc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  double *pdVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  float fVar18;
  
  Array2D<double>::Array2D
            (__return_storage_ptr__,
             (values->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x -
             (values->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x,
             (values->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y -
             (values->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y,
             (allocator_type)alloc.memoryResource);
  iVar15 = (values->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x;
  iVar1 = (values->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y;
  pfVar4 = values->values;
  iVar11 = (values->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x - iVar15;
  iVar16 = iVar11 * iVar1 + iVar15;
  fVar18 = (float)(((values->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y - iVar1) * iVar11);
  iVar2 = (__return_storage_ptr__->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x;
  iVar3 = (__return_storage_ptr__->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y;
  pdVar5 = __return_storage_ptr__->values;
  uVar6 = (__return_storage_ptr__->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x - iVar2;
  iVar12 = uVar6 * iVar3 + iVar2;
  uVar7 = -iVar12;
  uVar8 = (ulong)uVar7;
  pdVar5[(int)uVar7] = (double)(pfVar4[-iVar16] / fVar18);
  uVar10 = (ulong)uVar6;
  if (1 < (int)uVar6) {
    iVar12 = -iVar12;
    iVar16 = -iVar16;
    lVar17 = uVar10 - 1;
    do {
      iVar16 = iVar16 + 1;
      lVar13 = (long)iVar12;
      iVar12 = iVar12 + 1;
      pdVar5[iVar12] = (double)(pfVar4[iVar16] / fVar18) + pdVar5[lVar13];
      lVar17 = lVar17 + -1;
    } while (lVar17 != 0);
  }
  uVar9 = (__return_storage_ptr__->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y - iVar3;
  if (1 < (int)uVar9) {
    iVar12 = (1 - iVar3) * uVar6 - iVar2;
    iVar16 = (1 - iVar1) * iVar11 - iVar15;
    lVar17 = (ulong)uVar9 - 1;
    do {
      pdVar5[iVar12] = (double)(pfVar4[iVar16] / fVar18) + pdVar5[(int)uVar7];
      iVar12 = iVar12 + uVar6;
      iVar16 = iVar16 + iVar11;
      uVar7 = uVar7 + uVar6;
      lVar17 = lVar17 + -1;
    } while (lVar17 != 0);
  }
  if (1 < (int)uVar9) {
    uVar7 = 1;
    uVar14 = (ulong)((1 - iVar3) * uVar6 - iVar2);
    iVar15 = ((1 - iVar1) * iVar11 - iVar15) + 1;
    do {
      if (1 < (int)uVar6) {
        lVar17 = 0;
        do {
          iVar1 = (int)lVar17;
          iVar2 = (int)uVar8 + iVar1;
          pdVar5[(int)uVar14 + 1 + iVar1] =
               ((double)(pfVar4[iVar15 + iVar1] / fVar18) + pdVar5[(int)uVar14 + iVar1] +
               pdVar5[iVar2 + 1]) - pdVar5[iVar2];
          lVar17 = lVar17 + 1;
        } while (uVar10 - 1 != lVar17);
      }
      uVar7 = uVar7 + 1;
      uVar14 = uVar14 + uVar10;
      uVar8 = uVar8 + uVar10;
      iVar15 = iVar15 + iVar11;
    } while (uVar7 != uVar9);
  }
  return __return_storage_ptr__;
}

Assistant:

Array2D<double> integrate(const Array2D<Float> &values, Allocator alloc) {
        auto f = [&values](int x, int y) {
            return values(x, y) / (values.xSize() * values.ySize());
        };
        Array2D<double> result(values.xSize(), values.ySize(), alloc);
        result(0, 0) = f(0, 0);
        // Compute sums along first scanline and column
        for (int x = 1; x < result.xSize(); ++x)
            result(x, 0) = f(x, 0) + result(x - 1, 0);
        for (int y = 1; y < result.ySize(); ++y)
            result(0, y) = f(0, y) + result(0, y - 1);

        // Compute sums for the remainder of the entries
        for (int y = 1; y < result.ySize(); ++y)
            for (int x = 1; x < result.xSize(); ++x)
                result(x, y) = (f(x, y) + result(x - 1, y) + result(x, y - 1) -
                                result(x - 1, y - 1));

        return result;
    }